

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  long lVar3;
  
  pxVar2 = (xmlChar *)(*xmlMalloc)(10);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlCtxtErrMemory(ctxt);
  }
  else {
    xVar1 = *ctxt->input->cur;
    if ((byte)(xVar1 - 0x30) < 10) {
      *pxVar2 = xVar1;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        pxVar2[1] = '.';
        xmlNextChar(ctxt);
        xVar1 = *ctxt->input->cur;
        lVar3 = 2;
        while( true ) {
          if (9 < (byte)(xVar1 - 0x30)) {
            pxVar2[lVar3] = '\0';
            return pxVar2;
          }
          if (lVar3 == 9) break;
          pxVar2[lVar3] = xVar1;
          lVar3 = lVar3 + 1;
          xmlNextChar(ctxt);
          xVar1 = *ctxt->input->cur;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"VersionNum");
      }
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;

    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "VersionNum");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
	        xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}